

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.h
# Opt level: O0

void __thiscall
gmlc::networking::TcpConnection::TcpConnection
          (TcpConnection *this,SocketFactory *sf,io_context *io_context,size_t bufferSize)

{
  __int_type _Var1;
  allocator_type *in_RCX;
  undefined8 in_RDX;
  vector<char,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  bool active;
  atomic<unsigned_long> *in_stack_ffffffffffffffa0;
  TriggerVariable *this_00;
  undefined1 *__n;
  io_context *in_stack_ffffffffffffffd0;
  SocketFactory *in_stack_ffffffffffffffd8;
  
  std::enable_shared_from_this<gmlc::networking::TcpConnection>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpConnection> *)0x7720c7);
  std::atomic<unsigned_long>::atomic
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  SocketFactory::create_socket(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *(undefined8 *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
       in_RDX;
  __n = &stack0xffffffffffffffd3;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(in_RDI,(size_type)__n,in_RCX);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  active = false;
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffffa0,false);
  in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x1 = 0;
  this_00 = (TriggerVariable *)
            &in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8;
  concurrency::TriggerVariable::TriggerVariable(this_00,active);
  std::atomic<bool>::atomic(&this_00->triggered,active);
  concurrency::TriggerVariable::TriggerVariable(this_00,active);
  std::
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  ::function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
              *)this_00);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
            *)this_00);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00);
  std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::atomic
            ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)
             &in_RDI[0x17].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             PRESTART);
  _Var1 = std::__atomic_base<int>::operator++((__atomic_base<int> *)&idcounter,0);
  *(__int_type *)&in_RDI[0x17].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14 =
       _Var1;
  return;
}

Assistant:

TcpConnection(
            const SocketFactory& sf,
            asio::io_context& io_context,
            size_t bufferSize) :
            socket_(sf.create_socket(io_context)), context_(io_context),
            data(bufferSize), idcode(idcounter++)
        {
        }